

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

void print_int_array_list
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *list)

{
  FILE *__stream;
  size_type sVar1;
  const_reference this;
  uint *puVar2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RDI;
  size_t j;
  vector<int,_std::allocator<int>_> *array;
  size_t i;
  ulong local_20;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(in_RDI);
    if (sVar1 <= local_10) break;
    this = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](in_RDI,local_10);
    fprintf(_stderr,"[");
    local_20 = 0;
    while( true ) {
      sVar1 = std::vector<int,_std::allocator<int>_>::size(this);
      __stream = _stderr;
      if (sVar1 <= local_20) break;
      puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](this,local_20);
      fprintf(__stream,"%d",(ulong)*puVar2);
      sVar1 = std::vector<int,_std::allocator<int>_>::size(this);
      if (local_20 != sVar1 - 1) {
        fprintf(_stderr,",");
      }
      local_20 = local_20 + 1;
    }
    fprintf(_stderr,"]");
    sVar1 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(in_RDI);
    if (local_10 != sVar1 - 1) {
      fprintf(_stderr,",");
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

static void print_int_array_list(const std::vector<std::vector<int> >& list)
{
    for (size_t i = 0; i < list.size(); i++)
    {
        const std::vector<int>& array = list[i];
        fprintf(stderr, "[");
        for (size_t j = 0; j < array.size(); j++)
        {
            fprintf(stderr, "%d", array[j]);
            if (j != array.size() - 1)
                fprintf(stderr, ",");
        }
        fprintf(stderr, "]");
        if (i != list.size() - 1)
            fprintf(stderr, ",");
    }
}